

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj.cpp
# Opt level: O3

bool vera::hasSmoothingGroup(shape_t *shape)

{
  pointer puVar1;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  
  puVar1 = (shape->mesh).smoothing_group_ids.
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar3 = (long)(shape->mesh).smoothing_group_ids.
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)puVar1;
  if (lVar3 == 0) {
    return false;
  }
  uVar4 = lVar3 >> 2;
  if (*puVar1 != 0) {
    return true;
  }
  uVar2 = 1;
  do {
    uVar5 = uVar2;
    if (uVar4 + (uVar4 == 0) == uVar5) break;
    uVar2 = uVar5 + 1;
  } while (puVar1[uVar5] == 0);
  return uVar5 < uVar4;
}

Assistant:

bool hasSmoothingGroup(const tinyobj::shape_t& shape) {
    for (size_t i = 0; i < shape.mesh.smoothing_group_ids.size(); i++)
        if (shape.mesh.smoothing_group_ids[i] > 0)
            return true;
        
    return false;
}